

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

void mi_free(void *p)

{
  short *psVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  mi_segment_t *segment;
  mi_page_t *page;
  mi_threadid_t *in_FS_OFFSET;
  
  segment = (mi_segment_t *)((long)p - 1U & 0xfffffffffe000000);
  if (0 < (long)segment) {
    uVar4 = (ulong)((long)p - (long)segment) >> 0x10;
    lVar3 = uVar4 * 0x60 - (ulong)segment->slices[uVar4].slice_offset;
    page = (mi_page_t *)((long)segment + lVar3 + 0x120);
    if (segment->thread_id != *in_FS_OFFSET) {
      uVar4 = (long)p - *(long *)((long)segment + lVar3 + 0x150);
      bVar2 = *(byte *)((long)segment + lVar3 + 0x142);
      if (bVar2 == 0) {
        uVar4 = uVar4 % *(ulong *)((long)segment + lVar3 + 0x148);
      }
      else {
        uVar4 = uVar4 & ~(-1L << (bVar2 & 0x3f));
      }
      mi_free_block_mt(page,segment,(mi_block_t *)((long)p - uVar4));
      return;
    }
    if (*(char *)((long)segment + lVar3 + 0x12e) != '\0') {
      mi_free_generic_local(page,(mi_segment_t *)p,p);
      return;
    }
    *(undefined8 *)p = *(undefined8 *)((long)segment + lVar3 + 0x138);
    *(void **)((long)segment + lVar3 + 0x138) = p;
    psVar1 = (short *)((long)segment + lVar3 + 0x140);
    *psVar1 = *psVar1 + -1;
    if (*psVar1 == 0) {
      _mi_page_retire(page);
      return;
    }
  }
  return;
}

Assistant:

static inline mi_segment_t* _mi_ptr_segment(const void* p) {
  mi_segment_t* const segment = (mi_segment_t*)(((uintptr_t)p - 1) & ~MI_SEGMENT_MASK);
  #if MI_INTPTR_SIZE <= 4
  return (p==NULL ? NULL : segment);
  #else
  return ((intptr_t)segment <= 0 ? NULL : segment);
  #endif
}